

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this;
  initializer_list<unsigned_long> __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  bool bVar1;
  reference this_00;
  reference this_01;
  reference puVar2;
  ostream *poVar3;
  socklen_t sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  allocator<unsigned_long> *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_ad0;
  unsigned_long *j_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *i_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *__range1_1;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  scc_1;
  char local_9a0 [8];
  sockaddr local_998;
  sockaddr local_988;
  sockaddr local_978;
  sockaddr local_968;
  sockaddr local_958;
  sockaddr local_948;
  sockaddr local_938;
  sockaddr local_928;
  sockaddr local_918;
  sockaddr local_908;
  sockaddr local_8f8;
  sockaddr local_8e8;
  sockaddr local_8d8;
  sockaddr local_8c8;
  sockaddr local_8b8;
  sockaddr local_8a8;
  unsigned_long *local_898;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_890;
  undefined1 local_888 [8];
  Graph<unsigned_long,_scc::VectorType> graph_1;
  unsigned_long local_868 [13];
  iterator local_800;
  size_type local_7f8;
  undefined1 local_7f0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> nodes_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *j;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *i;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range1;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  scc;
  sockaddr local_778 [2];
  allocator<char> local_751;
  string local_750 [39];
  allocator<char> local_729;
  sockaddr local_728 [2];
  allocator<char> local_701;
  string local_700 [39];
  allocator<char> local_6d9;
  sockaddr local_6d8 [2];
  allocator<char> local_6b1;
  string local_6b0 [39];
  allocator<char> local_689;
  sockaddr local_688 [2];
  allocator<char> local_661;
  string local_660 [39];
  allocator<char> local_639;
  sockaddr local_638 [2];
  allocator<char> local_611;
  string local_610 [39];
  allocator<char> local_5e9;
  sockaddr local_5e8 [2];
  allocator<char> local_5c1;
  string local_5c0 [39];
  allocator<char> local_599;
  sockaddr local_598 [2];
  allocator<char> local_571;
  string local_570 [39];
  allocator<char> local_549;
  sockaddr local_548 [2];
  allocator<char> local_521;
  string local_520 [39];
  allocator<char> local_4f9;
  sockaddr local_4f8 [2];
  allocator<char> local_4d1;
  string local_4d0 [39];
  allocator<char> local_4a9;
  sockaddr local_4a8 [2];
  allocator<char> local_481;
  string local_480 [39];
  allocator<char> local_459;
  sockaddr local_458 [2];
  allocator<char> local_431;
  string local_430 [39];
  allocator<char> local_409;
  sockaddr local_408 [2];
  allocator<char> local_3e1;
  string local_3e0 [39];
  allocator<char> local_3b9;
  sockaddr local_3b8 [2];
  allocator<char> local_391;
  string local_390 [39];
  allocator<char> local_369;
  sockaddr local_368 [2];
  allocator<char> local_341;
  string local_340 [39];
  allocator<char> local_319;
  sockaddr local_318 [2];
  allocator<char> local_2f1;
  string local_2f0 [39];
  allocator<char> local_2c9;
  sockaddr local_2c8 [2];
  allocator<char> local_2a1;
  string local_2a0 [39];
  allocator<char> local_279;
  sockaddr local_278 [2];
  allocator<char> local_251;
  string local_250 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_230;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_228;
  undefined1 local_220 [8];
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  graph;
  allocator<char> local_1df;
  allocator<char> local_1de;
  allocator<char> local_1dd;
  allocator<char> local_1dc;
  allocator<char> local_1db;
  allocator<char> local_1da;
  allocator<char> local_1d9;
  allocator<char> local_1d8;
  allocator<char> local_1d7;
  allocator<char> local_1d6;
  allocator<char> local_1d5 [20];
  allocator<char> local_1c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nodes;
  
  nodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_1c0 = &local_1b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"A",&local_1c1);
  local_1c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_198,"B",local_1d5);
  local_1c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_178,"C",&local_1d6);
  local_1c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_158,"D",&local_1d7);
  local_1c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_138,"E",&local_1d8);
  local_1c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_118,"F",&local_1d9);
  local_1c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f8,"G",&local_1da);
  local_1c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"H",&local_1db);
  local_1c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b8,"I",&local_1dc);
  local_1c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_98,"J",&local_1dd);
  local_1c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_78,"K",&local_1de);
  local_1c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"L",&local_1df);
  local_38 = &local_1b8;
  local_30 = 0xc;
  this = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)((long)&graph.nodes._M_h._M_single_bucket + 7);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this);
  __l_00._M_len = local_30;
  __l_00._M_array = local_38;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_28,__l_00,this);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&graph.nodes._M_h._M_single_bucket + 7));
  pbVar5 = &local_1b8;
  local_ad0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38;
  do {
    local_ad0 = local_ad0 + -1;
    std::__cxx11::string::~string((string *)local_ad0);
  } while (local_ad0 != pbVar5);
  std::allocator<char>::~allocator(&local_1df);
  sVar4 = (socklen_t)pbVar5;
  std::allocator<char>::~allocator(&local_1de);
  std::allocator<char>::~allocator(&local_1dd);
  std::allocator<char>::~allocator(&local_1dc);
  std::allocator<char>::~allocator(&local_1db);
  std::allocator<char>::~allocator(&local_1da);
  std::allocator<char>::~allocator(&local_1d9);
  std::allocator<char>::~allocator(&local_1d8);
  std::allocator<char>::~allocator(&local_1d7);
  std::allocator<char>::~allocator(&local_1d6);
  std::allocator<char>::~allocator(local_1d5);
  std::allocator<char>::~allocator(&local_1c1);
  local_228._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_28);
  local_230 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_28);
  Graph<std::__cxx11::string,scc::AssocMapType>::
  Graph<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((Graph<std::__cxx11::string,scc::AssocMapType> *)local_220,local_228,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )local_230);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_250,"A",&local_251);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_278,"B",&local_279);
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect((Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
             *)local_220,(int)local_250,local_278,sVar4);
  std::__cxx11::string::~string((string *)local_278);
  std::allocator<char>::~allocator(&local_279);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator(&local_251);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2a0,"B",&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_2c8,"D",&local_2c9);
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect((Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
             *)local_220,(int)local_2a0,local_2c8,sVar4);
  std::__cxx11::string::~string((string *)local_2c8);
  std::allocator<char>::~allocator(&local_2c9);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2f0,"B",&local_2f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_318,"E",&local_319);
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect((Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
             *)local_220,(int)local_2f0,local_318,sVar4);
  std::__cxx11::string::~string((string *)local_318);
  std::allocator<char>::~allocator(&local_319);
  std::__cxx11::string::~string(local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_340,"B",&local_341);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_368,"C",&local_369);
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect((Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
             *)local_220,(int)local_340,local_368,sVar4);
  std::__cxx11::string::~string((string *)local_368);
  std::allocator<char>::~allocator(&local_369);
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::~allocator(&local_341);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_390,"C",&local_391);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_3b8,"F",&local_3b9);
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect((Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
             *)local_220,(int)local_390,local_3b8,sVar4);
  std::__cxx11::string::~string((string *)local_3b8);
  std::allocator<char>::~allocator(&local_3b9);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator(&local_391);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3e0,"E",&local_3e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_408,"B",&local_409);
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect((Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
             *)local_220,(int)local_3e0,local_408,sVar4);
  std::__cxx11::string::~string((string *)local_408);
  std::allocator<char>::~allocator(&local_409);
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator(&local_3e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_430,"E",&local_431);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_458,"F",&local_459);
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect((Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
             *)local_220,(int)local_430,local_458,sVar4);
  std::__cxx11::string::~string((string *)local_458);
  std::allocator<char>::~allocator(&local_459);
  std::__cxx11::string::~string(local_430);
  std::allocator<char>::~allocator(&local_431);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_480,"E",&local_481);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_4a8,"G",&local_4a9);
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect((Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
             *)local_220,(int)local_480,local_4a8,sVar4);
  std::__cxx11::string::~string((string *)local_4a8);
  std::allocator<char>::~allocator(&local_4a9);
  std::__cxx11::string::~string(local_480);
  std::allocator<char>::~allocator(&local_481);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4d0,"F",&local_4d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_4f8,"C",&local_4f9);
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect((Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
             *)local_220,(int)local_4d0,local_4f8,sVar4);
  std::__cxx11::string::~string((string *)local_4f8);
  std::allocator<char>::~allocator(&local_4f9);
  std::__cxx11::string::~string(local_4d0);
  std::allocator<char>::~allocator(&local_4d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_520,"F",&local_521);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_548,"H",&local_549);
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect((Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
             *)local_220,(int)local_520,local_548,sVar4);
  std::__cxx11::string::~string((string *)local_548);
  std::allocator<char>::~allocator(&local_549);
  std::__cxx11::string::~string(local_520);
  std::allocator<char>::~allocator(&local_521);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_570,"G",&local_571);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_598,"H",&local_599);
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect((Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
             *)local_220,(int)local_570,local_598,sVar4);
  std::__cxx11::string::~string((string *)local_598);
  std::allocator<char>::~allocator(&local_599);
  std::__cxx11::string::~string(local_570);
  std::allocator<char>::~allocator(&local_571);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5c0,"G",&local_5c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_5e8,"J",&local_5e9);
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect((Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
             *)local_220,(int)local_5c0,local_5e8,sVar4);
  std::__cxx11::string::~string((string *)local_5e8);
  std::allocator<char>::~allocator(&local_5e9);
  std::__cxx11::string::~string(local_5c0);
  std::allocator<char>::~allocator(&local_5c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_610,"H",&local_611);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_638,"K",&local_639);
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect((Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
             *)local_220,(int)local_610,local_638,sVar4);
  std::__cxx11::string::~string((string *)local_638);
  std::allocator<char>::~allocator(&local_639);
  std::__cxx11::string::~string(local_610);
  std::allocator<char>::~allocator(&local_611);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_660,"I",&local_661);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_688,"G",&local_689);
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect((Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
             *)local_220,(int)local_660,local_688,sVar4);
  std::__cxx11::string::~string((string *)local_688);
  std::allocator<char>::~allocator(&local_689);
  std::__cxx11::string::~string(local_660);
  std::allocator<char>::~allocator(&local_661);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_6b0,"J",&local_6b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_6d8,"I",&local_6d9);
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect((Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
             *)local_220,(int)local_6b0,local_6d8,sVar4);
  std::__cxx11::string::~string((string *)local_6d8);
  std::allocator<char>::~allocator(&local_6d9);
  std::__cxx11::string::~string(local_6b0);
  std::allocator<char>::~allocator(&local_6b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_700,"K",&local_701);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_728,"L",&local_729);
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect((Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
             *)local_220,(int)local_700,local_728,sVar4);
  std::__cxx11::string::~string((string *)local_728);
  std::allocator<char>::~allocator(&local_729);
  std::__cxx11::string::~string(local_700);
  std::allocator<char>::~allocator(&local_701);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_750,"L",&local_751);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_778,"J",
             (allocator<char> *)
             ((long)&scc.
                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::connect((Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
             *)local_220,(int)local_750,local_778,sVar4);
  std::__cxx11::string::~string((string *)local_778);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&scc.
                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string(local_750);
  std::allocator<char>::~allocator(&local_751);
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::scc((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         *)&__range1,
        (Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
         *)local_220);
  __end1 = std::
           vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::begin((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)&__range1);
  i = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)std::
         vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::end((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)&__range1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                *)&i);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              ::operator*(&__end1);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_00);
    j = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(this_00);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&j);
      if (!bVar1) break;
      nodes_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)__gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end2);
      poVar3 = std::operator<<((ostream *)&std::cout,
                               (string *)
                               nodes_1.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::operator<<(poVar3," ");
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)&__range1);
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
  ::~Graph((Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
            *)local_220);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_28);
  local_868[10] = 10;
  local_868[0xb] = 0xb;
  local_868[8] = 8;
  local_868[9] = 9;
  local_868[6] = 6;
  local_868[7] = 7;
  local_868[4] = 4;
  local_868[5] = 5;
  local_868[2] = 2;
  local_868[3] = 3;
  local_868[0] = 0;
  local_868[1] = 1;
  local_868[0xc] = 0xc;
  local_800 = local_868;
  local_7f8 = 0xd;
  this_02 = (allocator<unsigned_long> *)
            ((long)&graph_1.nodes.
                    super__Vector_base<Graph<unsigned_long,_scc::VectorType>::Node,_std::allocator<Graph<unsigned_long,_scc::VectorType>::Node>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_long>::allocator(this_02);
  __l._M_len = local_7f8;
  __l._M_array = local_800;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7f0,__l,this_02);
  sVar4 = (socklen_t)this_02;
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             ((long)&graph_1.nodes.
                     super__Vector_base<Graph<unsigned_long,_scc::VectorType>::Node,_std::allocator<Graph<unsigned_long,_scc::VectorType>::Node>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_890._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7f0);
  local_898 = (unsigned_long *)
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7f0);
  Graph<unsigned_long,scc::VectorType>::
  Graph<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Graph<unsigned_long,scc::VectorType> *)local_888,local_890,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )local_898);
  local_8a8.sa_data[6] = '\x01';
  local_8a8.sa_data[7] = '\0';
  local_8a8.sa_data[8] = '\0';
  local_8a8.sa_data[9] = '\0';
  local_8a8.sa_data[10] = '\0';
  local_8a8.sa_data[0xb] = '\0';
  local_8a8.sa_data[0xc] = '\0';
  local_8a8.sa_data[0xd] = '\0';
  local_8a8.sa_family = 2;
  local_8a8.sa_data[0] = '\0';
  local_8a8.sa_data[1] = '\0';
  local_8a8.sa_data[2] = '\0';
  local_8a8.sa_data[3] = '\0';
  local_8a8.sa_data[4] = '\0';
  local_8a8.sa_data[5] = '\0';
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)local_888,(int)&local_8a8 + 8,&local_8a8,sVar4
            );
  local_8b8.sa_data[6] = '\x02';
  local_8b8.sa_data[7] = '\0';
  local_8b8.sa_data[8] = '\0';
  local_8b8.sa_data[9] = '\0';
  local_8b8.sa_data[10] = '\0';
  local_8b8.sa_data[0xb] = '\0';
  local_8b8.sa_data[0xc] = '\0';
  local_8b8.sa_data[0xd] = '\0';
  local_8b8.sa_family = 4;
  local_8b8.sa_data[0] = '\0';
  local_8b8.sa_data[1] = '\0';
  local_8b8.sa_data[2] = '\0';
  local_8b8.sa_data[3] = '\0';
  local_8b8.sa_data[4] = '\0';
  local_8b8.sa_data[5] = '\0';
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)local_888,(int)&local_8b8 + 8,&local_8b8,sVar4
            );
  local_8c8.sa_data[6] = '\x02';
  local_8c8.sa_data[7] = '\0';
  local_8c8.sa_data[8] = '\0';
  local_8c8.sa_data[9] = '\0';
  local_8c8.sa_data[10] = '\0';
  local_8c8.sa_data[0xb] = '\0';
  local_8c8.sa_data[0xc] = '\0';
  local_8c8.sa_data[0xd] = '\0';
  local_8c8.sa_family = 5;
  local_8c8.sa_data[0] = '\0';
  local_8c8.sa_data[1] = '\0';
  local_8c8.sa_data[2] = '\0';
  local_8c8.sa_data[3] = '\0';
  local_8c8.sa_data[4] = '\0';
  local_8c8.sa_data[5] = '\0';
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)local_888,(int)&local_8c8 + 8,&local_8c8,sVar4
            );
  local_8d8.sa_data[6] = '\x02';
  local_8d8.sa_data[7] = '\0';
  local_8d8.sa_data[8] = '\0';
  local_8d8.sa_data[9] = '\0';
  local_8d8.sa_data[10] = '\0';
  local_8d8.sa_data[0xb] = '\0';
  local_8d8.sa_data[0xc] = '\0';
  local_8d8.sa_data[0xd] = '\0';
  local_8d8.sa_family = 3;
  local_8d8.sa_data[0] = '\0';
  local_8d8.sa_data[1] = '\0';
  local_8d8.sa_data[2] = '\0';
  local_8d8.sa_data[3] = '\0';
  local_8d8.sa_data[4] = '\0';
  local_8d8.sa_data[5] = '\0';
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)local_888,(int)&local_8d8 + 8,&local_8d8,sVar4
            );
  local_8e8.sa_data[6] = '\x03';
  local_8e8.sa_data[7] = '\0';
  local_8e8.sa_data[8] = '\0';
  local_8e8.sa_data[9] = '\0';
  local_8e8.sa_data[10] = '\0';
  local_8e8.sa_data[0xb] = '\0';
  local_8e8.sa_data[0xc] = '\0';
  local_8e8.sa_data[0xd] = '\0';
  local_8e8.sa_family = 6;
  local_8e8.sa_data[0] = '\0';
  local_8e8.sa_data[1] = '\0';
  local_8e8.sa_data[2] = '\0';
  local_8e8.sa_data[3] = '\0';
  local_8e8.sa_data[4] = '\0';
  local_8e8.sa_data[5] = '\0';
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)local_888,(int)&local_8e8 + 8,&local_8e8,sVar4
            );
  local_8f8.sa_data[6] = '\x05';
  local_8f8.sa_data[7] = '\0';
  local_8f8.sa_data[8] = '\0';
  local_8f8.sa_data[9] = '\0';
  local_8f8.sa_data[10] = '\0';
  local_8f8.sa_data[0xb] = '\0';
  local_8f8.sa_data[0xc] = '\0';
  local_8f8.sa_data[0xd] = '\0';
  local_8f8.sa_family = 2;
  local_8f8.sa_data[0] = '\0';
  local_8f8.sa_data[1] = '\0';
  local_8f8.sa_data[2] = '\0';
  local_8f8.sa_data[3] = '\0';
  local_8f8.sa_data[4] = '\0';
  local_8f8.sa_data[5] = '\0';
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)local_888,(int)&local_8f8 + 8,&local_8f8,sVar4
            );
  local_908.sa_data[6] = '\x05';
  local_908.sa_data[7] = '\0';
  local_908.sa_data[8] = '\0';
  local_908.sa_data[9] = '\0';
  local_908.sa_data[10] = '\0';
  local_908.sa_data[0xb] = '\0';
  local_908.sa_data[0xc] = '\0';
  local_908.sa_data[0xd] = '\0';
  local_908.sa_family = 6;
  local_908.sa_data[0] = '\0';
  local_908.sa_data[1] = '\0';
  local_908.sa_data[2] = '\0';
  local_908.sa_data[3] = '\0';
  local_908.sa_data[4] = '\0';
  local_908.sa_data[5] = '\0';
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)local_888,(int)&local_908 + 8,&local_908,sVar4
            );
  local_918.sa_data[6] = '\x05';
  local_918.sa_data[7] = '\0';
  local_918.sa_data[8] = '\0';
  local_918.sa_data[9] = '\0';
  local_918.sa_data[10] = '\0';
  local_918.sa_data[0xb] = '\0';
  local_918.sa_data[0xc] = '\0';
  local_918.sa_data[0xd] = '\0';
  local_918.sa_family = 7;
  local_918.sa_data[0] = '\0';
  local_918.sa_data[1] = '\0';
  local_918.sa_data[2] = '\0';
  local_918.sa_data[3] = '\0';
  local_918.sa_data[4] = '\0';
  local_918.sa_data[5] = '\0';
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)local_888,(int)&local_918 + 8,&local_918,sVar4
            );
  local_928.sa_data[6] = '\x06';
  local_928.sa_data[7] = '\0';
  local_928.sa_data[8] = '\0';
  local_928.sa_data[9] = '\0';
  local_928.sa_data[10] = '\0';
  local_928.sa_data[0xb] = '\0';
  local_928.sa_data[0xc] = '\0';
  local_928.sa_data[0xd] = '\0';
  local_928.sa_family = 3;
  local_928.sa_data[0] = '\0';
  local_928.sa_data[1] = '\0';
  local_928.sa_data[2] = '\0';
  local_928.sa_data[3] = '\0';
  local_928.sa_data[4] = '\0';
  local_928.sa_data[5] = '\0';
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)local_888,(int)&local_928 + 8,&local_928,sVar4
            );
  local_938.sa_data[6] = '\x06';
  local_938.sa_data[7] = '\0';
  local_938.sa_data[8] = '\0';
  local_938.sa_data[9] = '\0';
  local_938.sa_data[10] = '\0';
  local_938.sa_data[0xb] = '\0';
  local_938.sa_data[0xc] = '\0';
  local_938.sa_data[0xd] = '\0';
  local_938.sa_family = 8;
  local_938.sa_data[0] = '\0';
  local_938.sa_data[1] = '\0';
  local_938.sa_data[2] = '\0';
  local_938.sa_data[3] = '\0';
  local_938.sa_data[4] = '\0';
  local_938.sa_data[5] = '\0';
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)local_888,(int)&local_938 + 8,&local_938,sVar4
            );
  local_948.sa_data[6] = '\a';
  local_948.sa_data[7] = '\0';
  local_948.sa_data[8] = '\0';
  local_948.sa_data[9] = '\0';
  local_948.sa_data[10] = '\0';
  local_948.sa_data[0xb] = '\0';
  local_948.sa_data[0xc] = '\0';
  local_948.sa_data[0xd] = '\0';
  local_948.sa_family = 8;
  local_948.sa_data[0] = '\0';
  local_948.sa_data[1] = '\0';
  local_948.sa_data[2] = '\0';
  local_948.sa_data[3] = '\0';
  local_948.sa_data[4] = '\0';
  local_948.sa_data[5] = '\0';
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)local_888,(int)&local_948 + 8,&local_948,sVar4
            );
  local_958.sa_data[6] = '\a';
  local_958.sa_data[7] = '\0';
  local_958.sa_data[8] = '\0';
  local_958.sa_data[9] = '\0';
  local_958.sa_data[10] = '\0';
  local_958.sa_data[0xb] = '\0';
  local_958.sa_data[0xc] = '\0';
  local_958.sa_data[0xd] = '\0';
  local_958.sa_family = 10;
  local_958.sa_data[0] = '\0';
  local_958.sa_data[1] = '\0';
  local_958.sa_data[2] = '\0';
  local_958.sa_data[3] = '\0';
  local_958.sa_data[4] = '\0';
  local_958.sa_data[5] = '\0';
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)local_888,(int)&local_958 + 8,&local_958,sVar4
            );
  local_968.sa_data[6] = '\b';
  local_968.sa_data[7] = '\0';
  local_968.sa_data[8] = '\0';
  local_968.sa_data[9] = '\0';
  local_968.sa_data[10] = '\0';
  local_968.sa_data[0xb] = '\0';
  local_968.sa_data[0xc] = '\0';
  local_968.sa_data[0xd] = '\0';
  local_968.sa_family = 0xb;
  local_968.sa_data[0] = '\0';
  local_968.sa_data[1] = '\0';
  local_968.sa_data[2] = '\0';
  local_968.sa_data[3] = '\0';
  local_968.sa_data[4] = '\0';
  local_968.sa_data[5] = '\0';
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)local_888,(int)&local_968 + 8,&local_968,sVar4
            );
  local_978.sa_data[6] = '\t';
  local_978.sa_data[7] = '\0';
  local_978.sa_data[8] = '\0';
  local_978.sa_data[9] = '\0';
  local_978.sa_data[10] = '\0';
  local_978.sa_data[0xb] = '\0';
  local_978.sa_data[0xc] = '\0';
  local_978.sa_data[0xd] = '\0';
  local_978.sa_family = 7;
  local_978.sa_data[0] = '\0';
  local_978.sa_data[1] = '\0';
  local_978.sa_data[2] = '\0';
  local_978.sa_data[3] = '\0';
  local_978.sa_data[4] = '\0';
  local_978.sa_data[5] = '\0';
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)local_888,(int)&local_978 + 8,&local_978,sVar4
            );
  local_988.sa_data[6] = '\n';
  local_988.sa_data[7] = '\0';
  local_988.sa_data[8] = '\0';
  local_988.sa_data[9] = '\0';
  local_988.sa_data[10] = '\0';
  local_988.sa_data[0xb] = '\0';
  local_988.sa_data[0xc] = '\0';
  local_988.sa_data[0xd] = '\0';
  local_988.sa_family = 9;
  local_988.sa_data[0] = '\0';
  local_988.sa_data[1] = '\0';
  local_988.sa_data[2] = '\0';
  local_988.sa_data[3] = '\0';
  local_988.sa_data[4] = '\0';
  local_988.sa_data[5] = '\0';
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)local_888,(int)&local_988 + 8,&local_988,sVar4
            );
  local_998.sa_data[6] = '\v';
  local_998.sa_data[7] = '\0';
  local_998.sa_data[8] = '\0';
  local_998.sa_data[9] = '\0';
  local_998.sa_data[10] = '\0';
  local_998.sa_data[0xb] = '\0';
  local_998.sa_data[0xc] = '\0';
  local_998.sa_data[0xd] = '\0';
  local_998.sa_family = 0xc;
  local_998.sa_data[0] = '\0';
  local_998.sa_data[1] = '\0';
  local_998.sa_data[2] = '\0';
  local_998.sa_data[3] = '\0';
  local_998.sa_data[4] = '\0';
  local_998.sa_data[5] = '\0';
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)local_888,(int)&local_998 + 8,&local_998,sVar4
            );
  local_9a0[0] = '\f';
  local_9a0[1] = '\0';
  local_9a0[2] = '\0';
  local_9a0[3] = '\0';
  local_9a0[4] = '\0';
  local_9a0[5] = '\0';
  local_9a0[6] = '\0';
  local_9a0[7] = '\0';
  scc_1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0xa;
  Graph<unsigned_long,_scc::VectorType>::connect
            ((Graph<unsigned_long,_scc::VectorType> *)local_888,(int)local_9a0,
             (sockaddr *)
             &scc_1.
              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar4);
  Graph<unsigned_long,_scc::VectorType>::scc
            ((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              *)&__range1_1,(Graph<unsigned_long,_scc::VectorType> *)local_888);
  __end1_1 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::begin((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      *)&__range1_1);
  i_1 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
        std::
        vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::end((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               *)&__range1_1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                        *)&i_1);
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              ::operator*(&__end1_1);
    __end2_1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(this_01);
    j_1 = (unsigned_long *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(this_01);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2_1,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)&j_1);
      if (!bVar1) break;
      puVar2 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&__end2_1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*puVar2);
      std::operator<<(poVar3," ");
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&__end2_1);
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ::operator++(&__end1_1);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)&__range1_1);
  Graph<unsigned_long,_scc::VectorType>::~Graph((Graph<unsigned_long,_scc::VectorType> *)local_888);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7f0);
  return 0;
}

Assistant:

int main() {
    using namespace scc;
    {
        std::vector<std::string> nodes{
                "A", "B", "C", "D", "E", "F", "G", "H", "I", "J", "K", "L"
        };
        Graph<std::string, AssocMapType> graph{nodes.begin(), nodes.end()};
        graph.connect("A", "B");
        graph.connect("B", "D");
        graph.connect("B", "E");
        graph.connect("B", "C");
        graph.connect("C", "F");
        graph.connect("E", "B");
        graph.connect("E", "F");
        graph.connect("E", "G");
        graph.connect("F", "C");
        graph.connect("F", "H");
        graph.connect("G", "H");
        graph.connect("G", "J");
        graph.connect("H", "K");
        graph.connect("I", "G");
        graph.connect("J", "I");
        graph.connect("K", "L");
        graph.connect("L", "J");
        auto scc = graph.scc();
        for (auto &i: scc) {
            for (auto &j: i) {
                std::cout << j << " ";
            }
            std::cout << std::endl;
        }
    }

    {
        std::vector<size_t> nodes{
               0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12
        };
        Graph<size_t , VectorType> graph{nodes.begin(), nodes.end()};
        graph.connect(1, 2);
        graph.connect(2, 4);
        graph.connect(2, 5);
        graph.connect(2, 3);
        graph.connect(3, 6);
        graph.connect(5, 2);
        graph.connect(5, 6);
        graph.connect(5, 7);
        graph.connect(6, 3);
        graph.connect(6, 8);
        graph.connect(7, 8);
        graph.connect(7, 10);
        graph.connect(8, 11);
        graph.connect(9, 7);
        graph.connect(10, 9);
        graph.connect(11, 12);
        graph.connect(12, 10);
        auto scc = graph.scc();
        for (auto &i: scc) {
            for (auto &j: i) {
                std::cout << j << " ";
            }
            std::cout << std::endl;
        }
    }
    return 0;
}